

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O1

void nhdp_db_neighbor_addr_move(nhdp_neighbor *neigh,nhdp_naddr *naddr)

{
  avl_remove(&naddr->neigh->_neigh_addresses,&naddr->_neigh_node);
  avl_insert(&neigh->_neigh_addresses,&naddr->_neigh_node);
  naddr->neigh = neigh;
  return;
}

Assistant:

void
nhdp_db_neighbor_addr_move(struct nhdp_neighbor *neigh, struct nhdp_naddr *naddr) {
  /* remove from old neighbor */
  avl_remove(&naddr->neigh->_neigh_addresses, &naddr->_neigh_node);

  /* add to new neighbor */
  avl_insert(&neigh->_neigh_addresses, &naddr->_neigh_node);

  /* set new backlink */
  naddr->neigh = neigh;
}